

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidgetitemiterator.cpp
# Opt level: O1

void __thiscall
QTreeWidgetItemIteratorPrivate::ensureValidIterator
          (QTreeWidgetItemIteratorPrivate *this,QTreeWidgetItem *itemToBeRemoved)

{
  long lVar1;
  long *plVar2;
  QTreeWidget *this_00;
  long lVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QTreeWidgetItem *pQVar8;
  long extraout_RAX;
  long lVar9;
  QTreeWidgetItemIteratorPrivate *this_01;
  long lVar10;
  QTreeWidgetItemIterator *this_02;
  QTreeWidgetItem *par;
  QTreeWidgetItem *item;
  long in_FS_OFFSET;
  bool bVar11;
  QTreeWidgetItemIterator local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = this->q_ptr;
  item = this_02->current;
  if (item == (QTreeWidgetItem *)0x0) goto LAB_005c8089;
  pQVar8 = item;
  if (item->par != itemToBeRemoved->par) {
    do {
      item = pQVar8;
      if (item == itemToBeRemoved) break;
      pQVar8 = item->par;
    } while (item->par != (QTreeWidgetItem *)0x0);
  }
  if (item == itemToBeRemoved) {
    this_01 = this;
    if (item == (QTreeWidgetItem *)0x0) {
      bVar11 = true;
      pQVar8 = (QTreeWidgetItem *)0x0;
    }
    else {
      do {
        pQVar8 = nextSibling(this_01,item);
        item = item->par;
        bVar11 = pQVar8 == (QTreeWidgetItem *)0x0;
        if (item == (QTreeWidgetItem *)0x0) break;
      } while (pQVar8 == (QTreeWidgetItem *)0x0);
    }
    if (bVar11) {
      this_02->current = (QTreeWidgetItem *)0x0;
      QList<int>::clear(&(this->m_parentIndex).super_QList<int>);
    }
    else {
      QTreeWidgetItemIterator::QTreeWidgetItemIterator
                (&local_50,pQVar8,
                 (IteratorFlags)
                 (this_02->flags).
                 super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
                 super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i);
      QTreeWidgetItemIterator::operator=(this_02,&local_50);
      QTreeWidgetItemIterator::~QTreeWidgetItemIterator(&local_50);
      bVar5 = QTreeWidgetItemIterator::matchesFlags(this_02,pQVar8);
      if (!bVar5) {
        QTreeWidgetItemIterator::operator++(this_02);
      }
    }
    item = pQVar8;
    if (bVar11) goto LAB_005c8089;
  }
  pQVar8 = itemToBeRemoved->par;
  if (item->par != pQVar8) goto LAB_005c8089;
  this_00 = itemToBeRemoved->view;
  if (pQVar8 == (QTreeWidgetItem *)0x0) {
    iVar6 = QTreeWidget::indexOfTopLevelItem(this_00,itemToBeRemoved);
  }
  else {
    QTreeWidgetItem::executePendingSort(pQVar8);
    lVar3 = (pQVar8->children).d.size;
    if (lVar3 != 0) {
      lVar9 = -8;
      do {
        iVar6 = (int)this_02;
        lVar10 = lVar3 * -8 + lVar9;
        if (lVar10 == -8) goto LAB_005c8007;
        this_02 = (QTreeWidgetItemIterator *)(lVar9 + 8);
        plVar2 = (long *)((long)((pQVar8->children).d.ptr + 1) + lVar9);
        lVar9 = (long)this_02;
      } while ((QTreeWidgetItem *)*plVar2 != itemToBeRemoved);
      iVar6 = (int)((long)this_02 >> 3);
LAB_005c8007:
      if (lVar10 != -8) goto LAB_005c8024;
    }
    iVar6 = -1;
  }
LAB_005c8024:
  if (pQVar8 == (QTreeWidgetItem *)0x0) {
    iVar7 = QTreeWidget::indexOfTopLevelItem(this_00,item);
  }
  else {
    QTreeWidgetItem::executePendingSort(pQVar8);
    lVar3 = (pQVar8->children).d.size;
    if (lVar3 != 0) {
      lVar9 = extraout_RAX;
      lVar10 = -8;
      do {
        iVar7 = (int)lVar9;
        lVar1 = lVar3 * -8 + lVar10;
        if (lVar1 == -8) goto LAB_005c8068;
        lVar9 = lVar10 + 8;
        lVar4 = lVar10 + 8;
        lVar10 = lVar9;
      } while (*(QTreeWidgetItem **)((long)(pQVar8->children).d.ptr + lVar4) != item);
      iVar7 = (int)(lVar9 >> 3);
LAB_005c8068:
      if (lVar1 != -8) goto LAB_005c8082;
    }
    iVar7 = -1;
  }
LAB_005c8082:
  if (iVar6 <= iVar7) {
    this->m_currentIndex = this->m_currentIndex + -1;
  }
LAB_005c8089:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItemIteratorPrivate::ensureValidIterator(const QTreeWidgetItem *itemToBeRemoved)
{
    Q_Q(QTreeWidgetItemIterator);
    Q_ASSERT(itemToBeRemoved);

    if (!q->current) return;
    QTreeWidgetItem *nextItem = q->current;

    // Do not walk to the ancestor to find the other item if they have the same parent.
    if (nextItem->parent() != itemToBeRemoved->parent()) {
        while (nextItem->parent() && nextItem != itemToBeRemoved) {
            nextItem = nextItem->parent();
        }
    }
    // If the item to be removed is an ancestor of the current iterator item,
    // we need to adjust the iterator.
    if (nextItem == itemToBeRemoved) {
        QTreeWidgetItem *parent = nextItem;
        nextItem = nullptr;
        while (parent && !nextItem) {
            nextItem = nextSibling(parent);
            parent = parent->parent();
        }
        if (nextItem) {
            // Ooooh... Set the iterator to the next valid item
            *q = QTreeWidgetItemIterator(nextItem, q->flags);
            if (!(q->matchesFlags(nextItem))) ++(*q);
        } else {
            // set it to null.
            q->current = nullptr;
            m_parentIndex.clear();
            return;
        }
    }
    if (nextItem->parent() == itemToBeRemoved->parent()) {
        // They have the same parent, i.e. we have to adjust the m_currentIndex member of the iterator
        // if the deleted item is to the left of the nextItem.

        QTreeWidgetItem *par = itemToBeRemoved->parent();   // We know they both have the same parent.
        QTreeWidget *tw = itemToBeRemoved->treeWidget();    // ..and widget
        int indexOfItemToBeRemoved = par ? par->indexOfChild(const_cast<QTreeWidgetItem *>(itemToBeRemoved))
            : tw->indexOfTopLevelItem(const_cast<QTreeWidgetItem *>(itemToBeRemoved));
        int indexOfNextItem = par ? par->indexOfChild(nextItem) : tw->indexOfTopLevelItem(nextItem);

        if (indexOfItemToBeRemoved <= indexOfNextItem) {
            // A sibling to the left of us was deleted, adjust the m_currentIndex member of the iterator.
            // Note that the m_currentIndex will be wrong until the item is actually removed!
            m_currentIndex--;
        }
    }
}